

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::variableCheck(HlslParseContext *this,TIntermTyped **nodePtr)

{
  TIntermediate *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  undefined8 uVar4;
  long lVar5;
  TPoolAllocator *this_01;
  TVariable *this_02;
  TString *name;
  TSourceLoc *loc;
  TIntermSymbol *pTVar6;
  TType local_c8;
  long *plVar2;
  
  iVar1 = (*((*nodePtr)->super_TIntermNode)._vptr_TIntermNode[0xc])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    plVar3 = (long *)(**(code **)(*plVar2 + 0xf0))(plVar2);
    iVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
    if (iVar1 == 0) {
      uVar4 = (**(code **)*plVar2)(plVar2);
      lVar5 = (**(code **)(*plVar2 + 400))(plVar2);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,uVar4,"undeclared identifier",*(undefined8 *)(lVar5 + 8));
      lVar5 = (**(code **)(*plVar2 + 400))(plVar2);
      if (*(long *)(lVar5 + 0x10) != 0) {
        this_01 = GetThreadPoolAllocator();
        this_02 = (TVariable *)TPoolAllocator::allocate(this_01,0xf8);
        name = (TString *)(**(code **)(*plVar2 + 400))(plVar2);
        TType::TType(&local_c8,EbtFloat,EvqTemporary,1,0,0,false);
        TVariable::TVariable(this_02,name,name,&local_c8,false);
        TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_02);
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        loc = (TSourceLoc *)(**(code **)*plVar2)(plVar2);
        pTVar6 = TIntermediate::addSymbol(this_00,this_02,loc);
        *nodePtr = &pTVar6->super_TIntermTyped;
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::variableCheck(TIntermTyped*& nodePtr)
{
    TIntermSymbol* symbol = nodePtr->getAsSymbolNode();
    if (! symbol)
        return;

    if (symbol->getType().getBasicType() == EbtVoid) {
        error(symbol->getLoc(), "undeclared identifier", symbol->getName().c_str(), "");

        // Add to symbol table to prevent future error messages on the same name
        if (symbol->getName().size() > 0) {
            TVariable* fakeVariable = new TVariable(&symbol->getName(), TType(EbtFloat));
            symbolTable.insert(*fakeVariable);

            // substitute a symbol node for this new variable
            nodePtr = intermediate.addSymbol(*fakeVariable, symbol->getLoc());
        }
    }
}